

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedStorage.hpp
# Opt level: O1

void __thiscall
supermap::
OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
::appendCopy(OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
             *this,KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *elem)

{
  pointer *__ptr;
  KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *local_18;
  
  local_18 = (KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)operator_new(0x10);
  *(undefined4 *)(local_18->key).super_array<unsigned_char,_4UL>._M_elems =
       *(undefined4 *)(elem->key).super_array<unsigned_char,_4UL>._M_elems;
  (local_18->value).data_._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (elem->value).data_._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (elem->value).data_._M_t.
  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  (**this->_vptr_OrderedStorage)(this);
  if (local_18 != (KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_> *)0x0) {
    std::default_delete<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>::
    operator()((default_delete<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>_>
                *)&local_18,local_18);
  }
  return;
}

Assistant:

void appendCopy(T elem) {
        append(std::make_unique<T>(std::move(elem)));
    }